

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O2

void __thiscall ObjectBlockPool<16,_4096>::~ObjectBlockPool(ObjectBlockPool<16,_4096> *this)

{
  Reset(this);
  FastVector<SmallBlock<16>_*,_false,_false>::~FastVector(&this->objectsToFree);
  FastVector<SmallBlock<16>_*,_false,_false>::~FastVector(&this->objectsToFinalize);
  FastVector<LargeBlock<16,_4096>_*,_false,_false>::~FastVector(&this->sortedPages);
  return;
}

Assistant:

~ObjectBlockPool()
	{
		Reset();
	}